

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void __thiscall FNotifyBuffer::Draw(FNotifyBuffer *this)

{
  FNotifyText *pFVar1;
  bool bVar2;
  bool bVar3;
  FFont *font;
  DFrameBuffer *this_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int y;
  int iVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  double dVar13;
  
  bVar3 = con_centernotify.Value;
  if (1 < (uint)(gamestate + GS_FORCEWIPEBURN)) {
    iVar9 = 1;
    if (con_scaletext.Value == 1 && uiscale.Value == 0) {
      iVar9 = CleanYfac;
    }
    iVar9 = iVar9 * SmallFont->FontHeight;
    y = this->Top;
    BorderTopRefresh =
         (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])();
    if ((this->Text).Count != 0) {
      bVar2 = true;
      lVar10 = 8;
      uVar11 = 0;
      do {
        this_00 = screen;
        font = SmallFont;
        pFVar1 = (this->Text).Array;
        iVar12 = *(int *)((long)pFVar1 + lVar10 + -8);
        if (iVar12 != 0) {
          iVar6 = iVar12 - gametic;
          if (iVar6 == 0 || iVar12 < gametic) {
            if (bVar2) {
              this->Top = this->Top + iVar9;
              y = y + iVar9;
            }
            *(undefined4 *)((long)pFVar1 + lVar10 + -8) = 0;
          }
          else {
            iVar12 = *(int *)((long)pFVar1 + lVar10 + -4);
            if ((show_messages.Value != false) || (iVar12 == 0x80)) {
              dVar13 = (double)iVar6 / 6.0;
              if (5 < iVar6) {
                dVar13 = 1.0;
              }
              iVar6 = 0xb;
              if (iVar12 < 5) {
                iVar6 = PrintColors[iVar12];
              }
              if (con_scaletext.Value - 2U < 2) {
LAB_0035217b:
                if (bVar3) {
                  iVar12 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                  iVar4 = FFont::StringWidth(SmallFont,*(BYTE **)((long)&pFVar1->TimeOut + lVar10));
                  if (con_scaletext.Value == 3) {
                    iVar5 = 4;
                  }
                  else if (con_scaletext.Value == 2) {
                    iVar5 = 2;
                  }
                  else {
                    iVar5 = 1;
                    if (con_scaletext.Value == 1) {
                      iVar5 = uiscale.Value;
                    }
                  }
                  if (con_scaletext.Value == 3) {
                    iVar7 = 4;
                  }
                  else if (con_scaletext.Value == 2) {
                    iVar7 = 2;
                  }
                  else {
                    iVar7 = 1;
                    if (con_scaletext.Value == 1) {
                      iVar7 = uiscale.Value;
                    }
                  }
                  iVar12 = iVar12 - iVar5 * iVar4;
                  if (con_scaletext.Value == 3) {
                    iVar4 = 4;
                  }
                  else if (con_scaletext.Value == 2) {
                    iVar4 = 2;
                  }
                  else {
                    iVar4 = 1;
                    if (con_scaletext.Value == 1) {
                      iVar4 = uiscale.Value;
                    }
                  }
                  if (con_scaletext.Value == 3) {
                    iVar5 = 4;
                  }
                  else if (con_scaletext.Value == 2) {
                    iVar5 = 2;
                  }
                  else {
                    iVar5 = 1;
                    if (con_scaletext.Value == 1) {
                      iVar5 = uiscale.Value;
                    }
                  }
                  DCanvas::DrawText((DCanvas *)this_00,font,iVar6,
                                    (int)(CONCAT44(iVar12 - (iVar12 >> 0x1f) >> 0x1f,iVar12 / 2) /
                                         (long)iVar7),y,*(char **)((long)&pFVar1->TimeOut + lVar10),
                                    0x40001399,dVar13,
                                    (long)(screen->super_DSimpleCanvas).super_DCanvas.Width /
                                    (long)iVar4 & 0xffffffff,0x4000139a,
                                    (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                                    (long)iVar5 & 0xffffffff,0x400013a8,1,0x4000138c,0);
                }
                else {
                  if (con_scaletext.Value == 3) {
                    iVar12 = 4;
                  }
                  else if (con_scaletext.Value == 2) {
                    iVar12 = 2;
                  }
                  else {
                    iVar12 = 1;
                    if (con_scaletext.Value == 1) {
                      iVar12 = uiscale.Value;
                    }
                  }
                  if (con_scaletext.Value == 3) {
                    iVar4 = 4;
                  }
                  else if (con_scaletext.Value == 2) {
                    iVar4 = 2;
                  }
                  else {
                    iVar4 = 1;
                    if (con_scaletext.Value == 1) {
                      iVar4 = uiscale.Value;
                    }
                  }
                  DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar6,0,y,
                                    *(char **)((long)&pFVar1->TimeOut + lVar10),0x40001399,
                                    (long)(screen->super_DSimpleCanvas).super_DCanvas.Width /
                                    (long)iVar12 & 0xffffffff,0x4000139a,
                                    (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                                    (long)iVar4 & 0xffffffff,0x400013a8,1,0x4000138c,0);
                }
              }
              else {
                if (con_scaletext.Value == 1) {
                  if (uiscale.Value == 0) {
                    if (bVar3) {
                      iVar12 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                      iVar4 = FFont::StringWidth(SmallFont,
                                                 *(BYTE **)((long)&pFVar1->TimeOut + lVar10));
                      iVar12 = (iVar12 - iVar4 * CleanXfac) / 2;
                      pcVar8 = *(char **)((long)&pFVar1->TimeOut + lVar10);
                    }
                    else {
                      pcVar8 = *(char **)((long)&pFVar1->TimeOut + lVar10);
                      iVar12 = 0;
                    }
                    DCanvas::DrawText((DCanvas *)this_00,font,iVar6,iVar12,y,pcVar8,0x40001393,
                                      dVar13,1,0x4000138c,0);
                    goto LAB_00352563;
                  }
                  if ((con_scaletext.Value - 2U < 2) || (uiscale.Value != 1)) goto LAB_0035217b;
                }
                if (bVar3) {
                  iVar12 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                  iVar4 = FFont::StringWidth(SmallFont,*(BYTE **)((long)&pFVar1->TimeOut + lVar10));
                  iVar12 = (iVar12 - iVar4) / 2;
                  pcVar8 = *(char **)((long)&pFVar1->TimeOut + lVar10);
                }
                else {
                  pcVar8 = *(char **)((long)&pFVar1->TimeOut + lVar10);
                  iVar12 = 0;
                }
                DCanvas::DrawText((DCanvas *)this_00,font,iVar6,iVar12,y,pcVar8,0x4000138c,dVar13,0)
                ;
              }
LAB_00352563:
              y = y + iVar9;
              bVar2 = false;
            }
          }
        }
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x10;
      } while (uVar11 < (this->Text).Count);
      if (!bVar2) {
        return;
      }
    }
    this->Top = this->TopGoal;
  }
  return;
}

Assistant:

void FNotifyBuffer::Draw()
{
	bool center = (con_centernotify != 0.f);
	int line, lineadv, color, j;
	bool canskip;
	
	if (gamestate == GS_FULLCONSOLE || gamestate == GS_DEMOSCREEN/* || menuactive != MENU_Off*/)
		return;

	line = Top;
	canskip = true;

	lineadv = SmallFont->GetHeight ();
	if (active_con_scaletext() == 0)
	{
		lineadv *= CleanYfac;
	}

	BorderTopRefresh = screen->GetPageCount ();

	for (unsigned i = 0; i < Text.Size(); ++ i)
	{
		FNotifyText &notify = Text[i];

		if (notify.TimeOut == 0)
			continue;

		j = notify.TimeOut - gametic;
		if (j > 0)
		{
			if (!show_messages && notify.PrintLevel != 128)
				continue;

			double alpha = (j < NOTIFYFADETIME) ? 1. * j / NOTIFYFADETIME : 1;

			if (notify.PrintLevel >= PRINTLEVELS)
				color = CR_UNTRANSLATED;
			else
				color = PrintColors[notify.PrintLevel];

			if (active_con_scaletext() == 0)
			{
				if (!center)
					screen->DrawText (SmallFont, color, 0, line, notify.Text,
						DTA_CleanNoMove, true, DTA_AlphaF, alpha, TAG_DONE);
				else
					screen->DrawText (SmallFont, color, (SCREENWIDTH -
						SmallFont->StringWidth (notify.Text)*CleanXfac)/2,
						line, notify.Text, DTA_CleanNoMove, true,
						DTA_AlphaF, alpha, TAG_DONE);
			}
			else if (active_con_scaletext() == 1)
			{
				if (!center)
					screen->DrawText (SmallFont, color, 0, line, notify.Text,
						DTA_AlphaF, alpha, TAG_DONE);
				else
					screen->DrawText (SmallFont, color, (SCREENWIDTH -
						SmallFont->StringWidth (notify.Text))/2,
						line, notify.Text,
						DTA_AlphaF, alpha, TAG_DONE);
			}
			else
			{
				if (!center)
					screen->DrawText (SmallFont, color, 0, line, notify.Text,
						DTA_VirtualWidth, screen->GetWidth() / active_con_scaletext(),
						DTA_VirtualHeight, screen->GetHeight() / active_con_scaletext(),
						DTA_KeepRatio, true,
						DTA_AlphaF, alpha, TAG_DONE);
				else
					screen->DrawText (SmallFont, color, (screen->GetWidth() -
						SmallFont->StringWidth (notify.Text) * active_con_scaletext()) / 2 / active_con_scaletext(),
						line, notify.Text,
						DTA_VirtualWidth, screen->GetWidth() / active_con_scaletext(),
						DTA_VirtualHeight, screen->GetHeight() / active_con_scaletext(),
						DTA_KeepRatio, true,
						DTA_AlphaF, alpha, TAG_DONE);
			}
			line += lineadv;
			canskip = false;
		}
		else
		{
			if (canskip)
			{
				Top += lineadv;
				line += lineadv;
			}
			notify.TimeOut = 0;
		}
	}
	if (canskip)
	{
		Top = TopGoal;
	}
}